

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_delim_join.cpp
# Opt level: O0

vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> * __thiscall
duckdb::PhysicalDelimJoin::GetChildren(PhysicalDelimJoin *this)

{
  bool bVar1;
  long in_RSI;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *in_RDI;
  reference_wrapper<duckdb::PhysicalOperator> *child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *__range1;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *result;
  PhysicalHashAggregate *in_stack_ffffffffffffff68;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  *in_stack_ffffffffffffff70;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  *this_00;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  local_60;
  reference local_38;
  reference_wrapper<duckdb::PhysicalOperator> *local_30;
  __normal_iterator<const_std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
  local_28;
  long local_20;
  undefined1 local_11;
  
  local_11 = 0;
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true>::vector
            ((vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_true> *)0x1802a1e);
  local_20 = in_RSI + 0x10;
  local_28._M_current =
       (reference_wrapper<duckdb::PhysicalOperator> *)
       ::std::
       vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
       ::begin((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                *)in_stack_ffffffffffffff68);
  local_30 = (reference_wrapper<duckdb::PhysicalOperator> *)
             ::std::
             vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
             ::end((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
                    *)in_stack_ffffffffffffff68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                             *)in_stack_ffffffffffffff70,
                            (__normal_iterator<const_std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
                             *)in_stack_ffffffffffffff68), bVar1) {
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
               ::operator*(&local_28);
    ::std::reference_wrapper<duckdb::PhysicalOperator>::get(local_38);
    ::std::reference_wrapper<duckdb::PhysicalOperator_const>::
    reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator_const*>
              ((reference_wrapper<const_duckdb::PhysicalOperator> *)in_stack_ffffffffffffff70,
               &in_stack_ffffffffffffff68->super_PhysicalOperator);
    ::std::
    vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
    ::push_back(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
    __gnu_cxx::
    __normal_iterator<const_std::reference_wrapper<duckdb::PhysicalOperator>_*,_std::vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>_>
    ::operator++(&local_28);
  }
  ::std::reference_wrapper<duckdb::PhysicalOperator_const>::
  reference_wrapper<duckdb::PhysicalOperator&,void,duckdb::PhysicalOperator_const*>
            ((reference_wrapper<const_duckdb::PhysicalOperator> *)in_stack_ffffffffffffff70,
             &in_stack_ffffffffffffff68->super_PhysicalOperator);
  ::std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::push_back(in_stack_ffffffffffffff70,(value_type *)in_stack_ffffffffffffff68);
  this_00 = &local_60;
  ::std::reference_wrapper<duckdb::PhysicalOperator_const>::
  reference_wrapper<duckdb::PhysicalHashAggregate&,void,duckdb::PhysicalOperator_const*>
            ((reference_wrapper<const_duckdb::PhysicalOperator> *)this_00,in_stack_ffffffffffffff68)
  ;
  ::std::
  vector<std::reference_wrapper<const_duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<const_duckdb::PhysicalOperator>_>_>
  ::push_back(this_00,(value_type *)in_stack_ffffffffffffff68);
  return in_RDI;
}

Assistant:

vector<const_reference<PhysicalOperator>> PhysicalDelimJoin::GetChildren() const {
	vector<const_reference<PhysicalOperator>> result;
	for (auto &child : children) {
		result.push_back(child.get());
	}
	result.push_back(join);
	result.push_back(distinct);
	return result;
}